

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O1

void serialize_combined<_IO_FILE*>
               (IsoForest *model,ExtIsoForest *model_ext,Imputer *imputer,TreesIndexer *indexer,
               char *optional_metadata,size_t size_optional_metadata,_IO_FILE **out)

{
  pointer pSVar1;
  IsoForest *model_00;
  ExtIsoForest *model_01;
  size_t sVar2;
  long __off;
  runtime_error *this;
  size_t sVar3;
  SingleTreeIndex *node;
  pointer node_00;
  SignalSwitcher ss;
  size_t jump_ahead;
  undefined1 local_7a;
  undefined1 local_79;
  size_t local_78;
  size_t local_70;
  SignalSwitcher local_68;
  char *local_58;
  long local_50;
  IsoForest *local_48;
  ExtIsoForest *local_40;
  undefined8 local_38;
  
  local_78 = size_optional_metadata;
  local_58 = optional_metadata;
  SignalSwitcher::SignalSwitcher(&local_68);
  local_50 = ftell((FILE *)*out);
  add_setup_info<_IO_FILE*>(out,false);
  local_7a = 4;
  write_bytes<unsigned_char>(&local_7a,1,out);
  if (model == (IsoForest *)0x0) {
    if (model_ext == (ExtIsoForest *)0x0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Must pass one of \'model\' or \'model_ext\'.\n");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_78 == 0) {
      if (imputer == (Imputer *)0x0) {
        if (indexer == (TreesIndexer *)0x0) {
          local_7a = 2;
        }
        else {
          local_7a = 0xe;
        }
      }
      else if (indexer == (TreesIndexer *)0x0) {
        local_7a = 5;
      }
      else {
        local_7a = 0xf;
      }
    }
    else if (imputer == (Imputer *)0x0) {
      if (indexer == (TreesIndexer *)0x0) {
        local_7a = 7;
      }
      else {
        local_7a = 0x11;
      }
    }
    else if (indexer == (TreesIndexer *)0x0) {
      local_7a = 9;
    }
    else {
      local_7a = 0x13;
    }
  }
  else if (local_78 == 0) {
    if (imputer == (Imputer *)0x0) {
      if (indexer == (TreesIndexer *)0x0) {
        local_7a = 1;
      }
      else {
        local_7a = 0xc;
      }
    }
    else if (indexer == (TreesIndexer *)0x0) {
      local_7a = 4;
    }
    else {
      local_7a = 0xd;
    }
  }
  else if (imputer == (Imputer *)0x0) {
    if (indexer == (TreesIndexer *)0x0) {
      local_7a = 6;
    }
    else {
      local_7a = 0x10;
    }
  }
  else if (indexer == (TreesIndexer *)0x0) {
    local_7a = 8;
  }
  else {
    local_7a = 0x12;
  }
  write_bytes<unsigned_char>(&local_7a,1,out);
  if (model == (IsoForest *)0x0) {
    local_70 = get_size_model(model_ext);
  }
  else {
    local_70 = get_size_model(model);
  }
  write_bytes<unsigned_long>(&local_70,1,out);
  if (imputer == (Imputer *)0x0) {
    local_70 = 0;
  }
  else {
    local_70 = get_size_model(imputer);
  }
  write_bytes<unsigned_long>(&local_70,1,out);
  local_48 = model;
  local_40 = model_ext;
  if (indexer == (TreesIndexer *)0x0) {
    sVar3 = 0;
  }
  else {
    pSVar1 = (indexer->indices).
             super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    sVar3 = 8;
    for (node_00 = (indexer->indices).
                   super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                   super__Vector_impl_data._M_start; node_00 != pSVar1; node_00 = node_00 + 1) {
      sVar2 = get_size_node(node_00);
      sVar3 = sVar3 + sVar2;
    }
  }
  local_70 = sVar3;
  write_bytes<unsigned_long>(&local_70,1,out);
  model_01 = local_40;
  model_00 = local_48;
  write_bytes<unsigned_long>(&local_78,1,out);
  check_interrupt_switch(&local_68);
  if (model_00 == (IsoForest *)0x0) {
    serialize_model<_IO_FILE*>(model_01,out);
  }
  else {
    serialize_model<_IO_FILE*>(model_00,out);
  }
  if (imputer != (Imputer *)0x0) {
    serialize_model<_IO_FILE*>(imputer,out);
  }
  if (indexer != (TreesIndexer *)0x0) {
    serialize_model<_IO_FILE*>(indexer,out);
  }
  if (local_78 != 0) {
    write_bytes<char>(local_58,local_78,out);
  }
  check_interrupt_switch(&local_68);
  local_79 = 0;
  write_bytes<unsigned_char>(&local_79,1,out);
  local_38 = 0;
  write_bytes<unsigned_long>(&local_38,1,out);
  __off = ftell((FILE *)*out);
  fseek((FILE *)*out,local_50,0);
  write_bytes<unsigned_char>(watermark,0xd,out);
  fseek((FILE *)*out,__off,0);
  SignalSwitcher::~SignalSwitcher(&local_68);
  return;
}

Assistant:

void serialize_combined
(
    const IsoForest *model,
    const ExtIsoForest *model_ext,
    const Imputer *imputer,
    const TreesIndexer *indexer,
    const char *optional_metadata,
    const size_t size_optional_metadata,
    otype &out
)
{
    SignalSwitcher ss = SignalSwitcher();

    auto pos_watermark = set_return_position(out);

    add_setup_info(out, false);
    uint8_t model_type = AllObjectsCombined;
    write_bytes<uint8_t>((void*)&model_type, (size_t)1, out);

    if (model != NULL)
    {

        if (!size_optional_metadata)
        {
            if (imputer == NULL) {
                if (indexer == NULL)
                    model_type = HasSingleVarModelNext;
                else
                    model_type = HasSingleVarModelPlusIndexerNext;
            }
            else {
                if (indexer == NULL)
                    model_type = HasSingleVarModelPlusImputerNext;
                else
                    model_type = HasSingleVarModelPlusImputerPlusIndexerNext;
            }
        }

        else
        {
            if (imputer == NULL) {
                if (indexer == NULL)
                    model_type = HasSingleVarModelPlusMetadataNext;
                else
                    model_type = HasSingleVarModelPlusIndexerPlusMetadataNext;
            }
            else {
                if (indexer == NULL)
                    model_type = HasSingleVarModelPlusImputerPlusMetadataNext;
                else
                    model_type = HasSingleVarModelPlusImputerPlusIndexerPlusMetadataNext;
            }
        }

    }

    else if (model_ext != NULL)
    {

        if (!size_optional_metadata)
        {
            if (imputer == NULL) {
                if (indexer == NULL)
                    model_type = HasExtModelNext;
                else
                    model_type = HasExtModelPlusIndexerNext;
            }
            else {
                if (indexer == NULL)
                    model_type = HasExtModelPlusImputerNext;
                else
                    model_type = HasExtModelPlusImputerPlusIndexerNext;
            }
        }

        else
        {
            if (imputer == NULL) {
                if (indexer == NULL)
                    model_type = HasExtModelPlusMetadataNext;
                else
                    model_type = HasExtModelPlusIndexerPlusMetadataNext;
            }
            else {
                if (indexer == NULL)
                    model_type = HasExtModelPlusImputerPlusMetadataNext;
                else
                    model_type = HasExtModelPlusImputerPlusIndexerPlusMetadataNext;
            }
        }
    }

    else {
        throw std::runtime_error("Must pass one of 'model' or 'model_ext'.\n");
    }

    write_bytes<uint8_t>((void*)&model_type, (size_t)1, out);

    size_t size_model;
    if (model != NULL)
        size_model = get_size_model(*model);
    else
        size_model = get_size_model(*model_ext);
    write_bytes<size_t>((void*)&size_model, (size_t)1, out);

    if (imputer != NULL)
        size_model = get_size_model(*imputer);
    else
        size_model = 0;
    write_bytes<size_t>((void*)&size_model, (size_t)1, out);

    if (indexer != NULL)
        size_model = get_size_model(*indexer);
    else
        size_model = 0;
    write_bytes<size_t>((void*)&size_model, (size_t)1, out);

    write_bytes<size_t>((void*)&size_optional_metadata, (size_t)1, out);


    check_interrupt_switch(ss);

    if (model != NULL)
        serialize_model(*model, out);
    else
        serialize_model(*model_ext, out);

    if (imputer != NULL)
        serialize_model(*imputer, out);

    if (indexer != NULL)
        serialize_model(*indexer, out);

    if (size_optional_metadata)
        write_bytes<char>((void*)optional_metadata, size_optional_metadata, out);

    check_interrupt_switch(ss);

    uint8_t ending_type = (uint8_t)EndsHere;
    write_bytes<uint8_t>((void*)&ending_type, (size_t)1, out);
    size_t jump_ahead = 0;
    write_bytes<size_t>((void*)&jump_ahead, (size_t)1, out);

    auto end_pos = set_return_position(out);
    return_to_position(out, pos_watermark);
    add_full_watermark(out);
    return_to_position(out, end_pos);
}